

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

size_t tool_mime_stdin_read(char *buffer,size_t size,size_t nitems,void *arg)

{
  GlobalConfig *config;
  int iVar1;
  long lVar2;
  curl_off_t cVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  curl_off_t bytesleft;
  tool_mime *sip;
  void *arg_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  arg_local = (void *)nitems;
  if (-1 < *(long *)((long)arg + 0x58)) {
    if (*(long *)((long)arg + 0x58) <= *(long *)((long)arg + 0x60)) {
      return 0;
    }
    lVar2 = *(long *)((long)arg + 0x58) - *(long *)((long)arg + 0x60);
    cVar3 = curlx_uztoso(nitems);
    if (lVar2 < cVar3) {
      arg_local = (void *)curlx_sotouz(lVar2);
    }
  }
  if (arg_local != (void *)0x0) {
    if (*(long *)((long)arg + 0x18) == 0) {
      arg_local = (void *)fread(buffer,1,(size_t)arg_local,_stdin);
      iVar1 = ferror(_stdin);
      if (iVar1 != 0) {
        if (*(long *)((long)arg + 0x68) != 0) {
          config = *(GlobalConfig **)((long)arg + 0x68);
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          warnf(config,"stdin: %s\n",pcVar6);
          *(undefined8 *)((long)arg + 0x68) = 0;
        }
        return 0x10000000;
      }
    }
    else {
      lVar2 = *(long *)((long)arg + 0x18);
      sVar4 = curlx_sotouz(*(curl_off_t *)((long)arg + 0x60));
      memcpy(buffer,(void *)(lVar2 + sVar4),(size_t)arg_local);
    }
    cVar3 = curlx_uztoso((size_t)arg_local);
    *(curl_off_t *)((long)arg + 0x60) = cVar3 + *(long *)((long)arg + 0x60);
  }
  return (size_t)arg_local;
}

Assistant:

size_t tool_mime_stdin_read(char *buffer,
                            size_t size, size_t nitems, void *arg)
{
  tool_mime *sip = (tool_mime *) arg;
  curl_off_t bytesleft;
  (void) size;  /* Always 1: ignored. */

  if(sip->size >= 0) {
    if(sip->curpos >= sip->size)
      return 0;  /* At eof. */
    bytesleft = sip->size - sip->curpos;
    if(curlx_uztoso(nitems) > bytesleft)
      nitems = curlx_sotouz(bytesleft);
  }
  if(nitems) {
    if(sip->data) {
      /* Return data from memory. */
      memcpy(buffer, sip->data + curlx_sotouz(sip->curpos), nitems);
    }
    else {
      /* Read from stdin. */
      nitems = fread(buffer, 1, nitems, stdin);
      if(ferror(stdin)) {
        /* Show error only once. */
        if(sip->config) {
          warnf(sip->config, "stdin: %s\n", strerror(errno));
          sip->config = NULL;
        }
        return CURL_READFUNC_ABORT;
      }
    }
    sip->curpos += curlx_uztoso(nitems);
  }
  return nitems;
}